

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O0

void __thiscall
prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0::__0
          (__0 *this,anon_class_32_1_ba1d80cc_for__M_pred *param_1)

{
  anon_class_32_1_ba1d80cc_for__M_pred *param_1_local;
  anon_class_32_1_ba1d80cc_for__M_pred *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  return;
}

Assistant:

detail::Endpoint& Exposer::GetEndpointForUri(const std::string& uri) {
  auto sameUri = [uri](const std::unique_ptr<detail::Endpoint>& endpoint) {
    return endpoint->GetURI() == uri;
  };
  auto it = std::find_if(std::begin(endpoints_), std::end(endpoints_), sameUri);
  if (it != std::end(endpoints_)) {
    return *it->get();
  }

  endpoints_.emplace_back(detail::make_unique<detail::Endpoint>(*server_, uri));
  return *endpoints_.back().get();
}